

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbolize.cpp
# Opt level: O0

char * WTF::itoa_r(intptr_t i,char *buf,size_t sz,int base,size_t padding)

{
  char cVar1;
  char *pcVar2;
  bool local_5a;
  char *pcStack_58;
  char ch;
  char *ptr;
  uintptr_t j;
  char *start;
  size_t n;
  size_t padding_local;
  int base_local;
  size_t sz_local;
  char *buf_local;
  intptr_t i_local;
  
  start = (char *)0x1;
  if (sz == 0) {
    i_local = 0;
  }
  else if ((base < 2) || (0x10 < base)) {
    *buf = '\0';
    i_local = 0;
  }
  else {
    ptr = (char *)i;
    j = (uintptr_t)buf;
    if ((i < 0) && (base == 10)) {
      ptr = (char *)-i;
      start = (char *)0x2;
      if (sz < 2) {
        *buf = '\0';
        return (char *)0x0;
      }
      j = (uintptr_t)(buf + 1);
      *buf = '-';
    }
    pcStack_58 = (char *)j;
    n = padding;
    do {
      start = start + 1;
      if (sz < start) {
        *buf = '\0';
        return (char *)0x0;
      }
      pcVar2 = pcStack_58 + 1;
      *pcStack_58 = "0123456789abcdef"[(ulong)ptr % (ulong)(long)base];
      ptr = (char *)((ulong)ptr / (ulong)(long)base);
      if (n != 0) {
        n = n - 1;
      }
      local_5a = ptr != (char *)0x0 || n != 0;
      pcStack_58 = pcVar2;
    } while (local_5a);
    *pcVar2 = '\0';
    while (pcStack_58 = pcStack_58 + -1, i_local = (intptr_t)buf, j < pcStack_58) {
      cVar1 = *pcStack_58;
      *pcStack_58 = *(char *)j;
      *(char *)j = cVar1;
      j = j + 1;
    }
  }
  return (char *)i_local;
}

Assistant:

char *itoa_r(intptr_t i, char *buf, size_t sz, int base, size_t padding) {
  // Make sure we can write at least one NUL byte.
  size_t n = 1;
  if (n > sz)
    return NULL;

  if (base < 2 || base > 16) {
    buf[0] = '\000';
    return NULL;
  }

  char *start = buf;

  uintptr_t j = i;

  // Handle negative numbers (only for base 10).
  if (i < 0 && base == 10) {
    j = -i;

    // Make sure we can write the '-' character.
    if (++n > sz) {
      buf[0] = '\000';
      return NULL;
    }
    *start++ = '-';
  }

  // Loop until we have converted the entire number. Output at least one
  // character (i.e. '0').
  char *ptr = start;
  do {
    // Make sure there is still enough space left in our output buffer.
    if (++n > sz) {
      buf[0] = '\000';
      return NULL;
    }

    // Output the next digit.
    *ptr++ = "0123456789abcdef"[j % base];
    j /= base;

    if (padding > 0)
      padding--;
  } while (j > 0 || padding > 0);

  // Terminate the output with a NUL character.
  *ptr = '\000';

  // Conversion to ASCII actually resulted in the digits being in reverse
  // order. We can't easily generate them in forward order, as we can't tell
  // the number of characters needed until we are done converting.
  // So, now, we reverse the string (except for the possible "-" sign).
  while (--ptr > start) {
    char ch = *ptr;
    *ptr = *start;
    *start++ = ch;
  }
  return buf;
}